

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::RowGroup
          (RowGroup *this,RowGroupCollection *collection_p,PersistentRowGroupData *data)

{
  BlockManager *block_manager;
  RowGroupCollection *pRVar1;
  idx_t iVar2;
  DataTableInfo *info;
  const_reference type;
  ColumnData *this_00;
  reference column_data;
  ulong __n;
  shared_ptr<duckdb::ColumnData,_true> entry;
  
  iVar2 = data->count;
  (this->super_SegmentBase<duckdb::RowGroup>).start = data->start;
  (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i = iVar2;
  (this->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p = (__pointer_type)0x0;
  (this->collection)._M_data = collection_p;
  this->allocation_size = 0;
  switchD_014c3389::default(&this->version_info,0,0x90);
  block_manager = collection_p->block_manager;
  info = GetTableInfo(this);
  pRVar1 = (this->collection)._M_data;
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
  ::reserve(&(this->columns).
             super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
            ,((long)(pRVar1->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pRVar1->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  for (__n = 0; __n < (ulong)(((long)(pRVar1->types).
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pRVar1->types).
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    iVar2 = data->start;
    type = vector<duckdb::LogicalType,_true>::get<true>(&pRVar1->types,__n);
    ColumnData::CreateColumn
              ((ColumnData *)&entry,block_manager,info,__n,iVar2,type,
               (optional_ptr<duckdb::ColumnData,_true>)0x0);
    this_00 = shared_ptr<duckdb::ColumnData,_true>::operator->(&entry);
    column_data = vector<duckdb::PersistentColumnData,_true>::get<true>(&data->column_data,__n);
    ColumnData::InitializeColumn(this_00,column_data);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::ColumnData,true>>
              ((vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
                *)&this->columns,&entry);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry.internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

RowGroup::RowGroup(RowGroupCollection &collection_p, PersistentRowGroupData &data)
    : SegmentBase<RowGroup>(data.start, data.count), collection(collection_p), version_info(nullptr),
      allocation_size(0) {
	auto &block_manager = GetBlockManager();
	auto &info = GetTableInfo();
	auto &types = collection.get().GetTypes();
	columns.reserve(types.size());
	for (idx_t c = 0; c < types.size(); c++) {
		auto entry = ColumnData::CreateColumn(block_manager, info, c, data.start, types[c], nullptr);
		entry->InitializeColumn(data.column_data[c]);
		columns.push_back(std::move(entry));
	}

	Verify();
}